

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outArgs,char *filename)

{
  pointer pcVar1;
  bool bVar2;
  pointer __x;
  cmListFileArgument *i;
  pointer pcVar3;
  string value;
  string efp;
  
  GetExecutionFilePath_abi_cxx11_(&efp,this);
  if (filename == (char *)0x0) {
    filename = (char *)efp._M_dataplus;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(outArgs,((long)(inArgs->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inArgs->
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x48);
  pcVar3 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pcVar3 == pcVar1) {
      bVar2 = cmSystemTools::GetFatalErrorOccured();
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&efp);
      return !bVar2;
    }
    __x = pcVar3;
    if (pcVar3->Delim == Bracket) {
LAB_001769fc:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outArgs,&__x->Value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&value);
      ExpandVariablesInString(this,&value,false,false,false,filename,pcVar3->Line,false,false);
      __x = (pointer)&value;
      if (pcVar3->Delim == Quoted) goto LAB_001769fc;
      cmSystemTools::ExpandListArgument(&value,outArgs,false);
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

bool cmMakefile::ExpandArguments(std::vector<cmListFileArgument> const& inArgs,
                                 std::vector<std::string>& outArgs,
                                 const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename) {
    filename = efp.c_str();
  }
  std::string value;
  outArgs.reserve(inArgs.size());
  for (cmListFileArgument const& i : inArgs) {
    // No expansion in a bracket argument.
    if (i.Delim == cmListFileArgument::Bracket) {
      outArgs.push_back(i.Value);
      continue;
    }
    // Expand the variables in the argument.
    value = i.Value;
    this->ExpandVariablesInString(value, false, false, false, filename, i.Line,
                                  false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i.Delim == cmListFileArgument::Quoted) {
      outArgs.push_back(value);
    } else {
      cmSystemTools::ExpandListArgument(value, outArgs);
    }
  }
  return !cmSystemTools::GetFatalErrorOccured();
}